

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/3rdparty/Catch2/catch.hpp:9833:20)>
::setFlag(ParserResult *__return_storage_ptr__,
         BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]semver_test_3rdparty_Catch2_catch_hpp:9833:20)>
         *this,bool flag)

{
  ((this->m_lambda).config)->abortAfter = 1;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00193aa8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
            return LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( m_lambda, flag );
        }